

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

bool __thiscall cplus::utils::List<int_*>::append(List<int_*> *this,int **value)

{
  ListPoint *pLVar1;
  
  if (this->state == (ListPoint *)0x0) {
    pLVar1 = (ListPoint *)operator_new(0x10);
    ListPoint::ListPoint(pLVar1,this->listEnd,this->listBegin,value);
    this->state = pLVar1;
    this->preview = pLVar1;
    this->listBegin = pLVar1;
    this->listEnd = pLVar1;
  }
  else {
    if (this->listSize == this->maxSize) {
      return false;
    }
    pLVar1 = (ListPoint *)operator_new(0x10);
    ListPoint::ListPoint(pLVar1,this->listEnd,this->listBegin,value);
    this->listEnd = pLVar1;
    this->listSize = this->listSize + 1;
  }
  return true;
}

Assistant:

bool append(const T &value) {
				if (state == nullptr) {
					state = new ListPoint(listEnd, listBegin, value);
					listEnd = listBegin = preview = state;
				} else if (listSize != maxSize) {
					listEnd = new ListPoint(listEnd, listBegin, value);
					++listSize;
				} else {
					return false;
				}
				return true;
			}